

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_ipairs_aux(jit_State *J,RecordFFData *rd)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  TRef TVar3;
  int iVar4;
  long *in_RSI;
  jit_State *in_RDI;
  jit_State *J_00;
  RecordIndex ix;
  jit_State *in_stack_ffffffffffffff38;
  jit_State *J_01;
  undefined6 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff46;
  undefined4 uVar5;
  int32_t k;
  undefined2 in_stack_ffffffffffffffe8;
  undefined2 uVar6;
  
  if ((*in_RDI->base & 0x1f000000) == 0xb000000) {
    if (0xfffeffff < *(uint *)(*in_RSI + 0xc)) {
      lj_trace_err((jit_State *)CONCAT26(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40),
                   (TraceError)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    }
    J_00 = (jit_State *)(double)((int)*(double *)(*in_RSI + 8) + 1);
    uVar5 = *(undefined4 *)*in_RSI;
    k = -0xc;
    TVar3 = lj_opt_narrow_toint(in_stack_ffffffffffffff38,0);
    IVar1 = (IRRef1)TVar3;
    J_01 = in_RDI;
    TVar3 = lj_ir_kint(J_00,k);
    uVar6 = 0x2813;
    IVar2 = (IRRef1)TVar3;
    (J_01->fold).ins.field_0.ot = 0x2813;
    (J_01->fold).ins.field_0.op1 = IVar1;
    (J_01->fold).ins.field_0.op2 = IVar2;
    TVar3 = lj_opt_fold((jit_State *)CONCAT44(k,uVar5));
    *in_RDI->base = TVar3;
    TVar3 = lj_record_idx(J_01,(RecordIndex *)
                               CONCAT26(uVar6,CONCAT24(IVar1,CONCAT22(IVar2,
                                                  in_stack_ffffffffffffffe8))));
    in_RDI->base[1] = TVar3;
    iVar4 = 2;
    if ((in_RDI->base[1] & 0x1f000000) == 0) {
      iVar4 = 0;
    }
    in_RSI[1] = (long)iVar4;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_ipairs_aux(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  if (tref_istab(ix.tab)) {
    if (!tvisnumber(&rd->argv[1]))  /* No support for string coercion. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    setintV(&ix.keyv, numberVint(&rd->argv[1])+1);
    settabV(J->L, &ix.tabv, tabV(&rd->argv[0]));
    ix.val = 0; ix.idxchain = 0;
    ix.key = lj_opt_narrow_toint(J, J->base[1]);
    J->base[0] = ix.key = emitir(IRTI(IR_ADD), ix.key, lj_ir_kint(J, 1));
    J->base[1] = lj_record_idx(J, &ix);
    rd->nres = tref_isnil(J->base[1]) ? 0 : 2;
  }  /* else: Interpreter will throw. */
}